

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O1

void __thiscall CNetTokenCache::~CNetTokenCache(CNetTokenCache *this)

{
  CConnlessPacketInfo *pCVar1;
  CConnlessPacketInfo *pCVar2;
  
  pCVar2 = this->m_pConnlessPacketList;
  while (pCVar2 != (CConnlessPacketInfo *)0x0) {
    pCVar1 = pCVar2->m_pNext;
    operator_delete(pCVar2,0x5c0);
    this->m_pConnlessPacketList = pCVar1;
    pCVar2 = pCVar1;
  }
  this->m_pConnlessPacketList = (CConnlessPacketInfo *)0x0;
  return;
}

Assistant:

CNetTokenCache::~CNetTokenCache()
{
	// delete the linked list
	while(m_pConnlessPacketList)
	{
		CConnlessPacketInfo *pTemp = m_pConnlessPacketList->m_pNext;
		delete m_pConnlessPacketList;
		m_pConnlessPacketList = pTemp;
	}
	m_pConnlessPacketList = 0;
}